

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLFormatter::writeCharRef(XMLFormatter *this,XMLSize_t toWrite)

{
  long lVar1;
  long lVar2;
  XMLCh tmpBuf [64];
  XMLCh local_88 [64];
  
  local_88[0] = L'&';
  local_88[1] = L'#';
  local_88[2] = 0x78;
  XMLString::sizeToText(toWrite,local_88 + 3,0x20,0x10,this->fMemoryManager);
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    lVar1 = lVar2 + 2;
  } while (*(short *)((long)local_88 + lVar2) != 0);
  *(undefined4 *)((long)local_88 + lVar2) = 0x3b;
  formatBuf(this,local_88,lVar2 + 2 >> 1,NoEscapes,UnRep_Fail);
  return;
}

Assistant:

void XMLFormatter::writeCharRef(XMLSize_t toWrite)
{
    XMLCh tmpBuf[64];
    tmpBuf[0] = chAmpersand;
    tmpBuf[1] = chPound;
    tmpBuf[2] = chLatin_x;

    // Build a char ref for the current char
    XMLString::sizeToText(toWrite, &tmpBuf[3], 32, 16, fMemoryManager);
    const XMLSize_t bufLen = XMLString::stringLen(tmpBuf);
    tmpBuf[bufLen] = chSemiColon;
    tmpBuf[bufLen+1] = chNull;

    // write it out
    formatBuf(tmpBuf
            , bufLen + 1
            , XMLFormatter::NoEscapes
            , XMLFormatter::UnRep_Fail);

}